

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::FormalArgumentSymbol::FormalArgumentSymbol
          (FormalArgumentSymbol *this,string_view name,SourceLocation loc,
          ArgumentDirection direction,VariableLifetime lifetime)

{
  bitmask<slang::ast::DeclaredTypeFlags> *pbVar1;
  
  ValueSymbol::ValueSymbol
            ((ValueSymbol *)this,FormalArgument,name,loc,(bitmask<slang::ast::DeclaredTypeFlags>)0x0
            );
  (this->super_VariableSymbol).lifetime = lifetime;
  (this->super_VariableSymbol).flags.m_bits = 0;
  if (lifetime == Automatic) {
    pbVar1 = &(this->super_VariableSymbol).super_ValueSymbol.declaredType.flags;
    *(byte *)&pbVar1->m_bits = (byte)pbVar1->m_bits | 0x10;
  }
  this->direction = direction;
  this->mergedVar = (VariableSymbol *)0x0;
  this->defaultValSyntax = (ExpressionSyntax *)0x0;
  this->defaultVal = (Expression *)0x0;
  return;
}

Assistant:

FormalArgumentSymbol::FormalArgumentSymbol(std::string_view name, SourceLocation loc,
                                           ArgumentDirection direction, VariableLifetime lifetime) :
    VariableSymbol(SymbolKind::FormalArgument, name, loc, lifetime), direction(direction) {
}